

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O3

Error __thiscall
asmjit::RAInstBuilder::add
          (RAInstBuilder *this,RAWorkReg *workReg,uint32_t flags,uint32_t allocable,uint32_t useId,
          uint32_t useRewriteMask,uint32_t outId,uint32_t outRewriteMask,uint32_t rmSize)

{
  uint32_t *puVar1;
  uint *puVar2;
  uint32_t uVar3;
  RATiedReg *pRVar4;
  long lVar5;
  BaseNode *pBVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  uint8_t uVar11;
  Error EVar12;
  RABlock *pRVar13;
  RABlock *pRVar14;
  long lVar15;
  undefined8 extraout_RAX;
  byte bVar16;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar17;
  byte bVar19;
  InvokeNode *initialNode;
  ulong uVar20;
  ulong uVar21;
  BaseRAPass *this_00;
  uint uVar22;
  long lVar23;
  RARegMask *item;
  InvokeNode *invokeNode;
  uint64_t uVar24;
  float __x;
  uint32_t uStack_cd4;
  RARegMask *pRStack_cd0;
  LabelNode *pLStack_cc8;
  ZoneVector<asmjit::RABlock_*> ZStack_cc0;
  long lStack_cb0;
  RABlock *pRStack_ca8;
  RAInstBuilder RStack_ca0;
  RATiedReg *pRStack_68;
  RATiedReg *pRVar18;
  
  uVar22 = (workReg->_info)._signature >> 8 & 0xf;
  uVar20 = (ulong)uVar22;
  pRVar18 = workReg->_tiedReg;
  bVar16 = (byte)useId;
  if (useId == 0xff) {
LAB_00133183:
    bVar19 = (byte)outId;
    if (outId != 0xff) {
      if (3 < uVar22) goto LAB_001332a6;
      puVar1 = (this->_clobbered)._masks + uVar20;
      *puVar1 = *puVar1 | 1 << (bVar19 & 0x1f);
      flags = flags | 0x2000;
    }
    this->_aggregatedFlags = this->_aggregatedFlags | flags;
    (this->_stats)._packed = (this->_stats)._packed | 1 << (sbyte)uVar22;
    if (pRVar18 != (RATiedReg *)0x0) {
      if (useId != 0xff) {
        if ((pRVar18->field_5).field_0._useId != 0xff) {
          return 0x41;
        }
        (pRVar18->field_5).field_0._useId = bVar16;
      }
      if (outId != 0xff) {
        if ((pRVar18->field_5).field_0._outId != 0xff) {
          return 0x41;
        }
        (pRVar18->field_5).field_0._outId = bVar19;
      }
      (pRVar18->field_5).field_0._refCount = (pRVar18->field_5).field_0._refCount + '\x01';
      pRVar18->_flags = pRVar18->_flags | flags;
      pRVar18->_allocableRegs = pRVar18->_allocableRegs & allocable;
      pRVar18->_useRewriteMask = pRVar18->_useRewriteMask | useRewriteMask;
      pRVar18->_outRewriteMask = pRVar18->_outRewriteMask | outRewriteMask;
      bVar16 = (pRVar18->field_5).field_0._rmSize;
      bVar19 = (byte)rmSize;
      if (rmSize < bVar16) {
        bVar19 = bVar16;
      }
      (pRVar18->field_5).field_0._rmSize = bVar19;
      return 0;
    }
    pRVar4 = this->_cur;
    uVar17 = (int)((ulong)((long)pRVar4 + (-0x38 - (long)this)) >> 3) * -0x55555555;
    pRVar18 = (RATiedReg *)(ulong)uVar17;
    if ((uVar17 & 0xffffff80) != 0) goto LAB_001332ab;
    this->_cur = pRVar4 + 1;
    pRVar18 = (RATiedReg *)(ulong)workReg->_workId;
    pRVar4->_workId = workReg->_workId;
    pRVar4->_flags = flags;
    pRVar4->_allocableRegs = allocable;
    pRVar4->_useRewriteMask = useRewriteMask;
    pRVar4->_outRewriteMask = outRewriteMask;
    (pRVar4->field_5).field_0._refCount = '\x01';
    (pRVar4->field_5).field_0._useId = bVar16;
    (pRVar4->field_5).field_0._outId = bVar19;
    (pRVar4->field_5).field_0._rmSize = (byte)rmSize;
    workReg->_tiedReg = pRVar4;
    if (3 < uVar22) goto LAB_001332b0;
    if (*(char *)((long)(this->_used)._masks + (uVar20 - 8)) != -1) {
      (this->_count).field_0._packed =
           (this->_count).field_0._packed + (1 << ((byte)(uVar22 << 3) & 0x1f));
      return 0;
    }
  }
  else {
    (this->_stats)._packed = (this->_stats)._packed | 0x100 << (sbyte)uVar22;
    if (uVar22 < 4) {
      puVar1 = (this->_used)._masks + uVar20;
      *puVar1 = *puVar1 | 1 << (bVar16 & 0x1f);
      flags = flags | 0x1000;
      goto LAB_00133183;
    }
    add();
LAB_001332a6:
    add();
LAB_001332ab:
    add();
LAB_001332b0:
    add();
  }
  add();
  if (extraout_EDX == 0xff) {
    addCallArg();
LAB_0013339f:
    addCallArg();
LAB_001333a4:
    addCallArg();
  }
  else {
    uVar22 = (workReg->_info)._signature >> 8 & 0xf;
    bVar16 = (byte)extraout_EDX;
    uVar17 = 1 << (bVar16 & 0x1f);
    this->_aggregatedFlags = this->_aggregatedFlags | 0x1101;
    if (3 < uVar22) goto LAB_0013339f;
    puVar1 = (this->_used)._masks + uVar22;
    *puVar1 = *puVar1 | uVar17;
    (this->_stats)._packed = (this->_stats)._packed | 0x101 << (sbyte)uVar22;
    pRVar4 = workReg->_tiedReg;
    if (pRVar4 != (RATiedReg *)0x0) {
      if ((pRVar4->field_5).field_0._useId == 0xff) {
        (pRVar4->field_5).field_0._useId = bVar16;
        pRVar4->_allocableRegs = pRVar4->_allocableRegs & uVar17;
        uVar22 = 0x1101;
      }
      else {
        pRVar4->_allocableRegs = pRVar4->_allocableRegs | uVar17;
        uVar22 = 0x11101;
      }
      (pRVar4->field_5).field_0._refCount = (pRVar4->field_5).field_0._refCount + '\x01';
      pRVar4->_flags = pRVar4->_flags | uVar22;
      return 0;
    }
    pRVar4 = this->_cur;
    if (((int)((ulong)((long)pRVar4 + (-0x38 - (long)this)) >> 3) * -0x55555555 & 0xffffff80U) != 0)
    goto LAB_001333a4;
    this->_cur = pRVar4 + 1;
    pRVar4->_workId = workReg->_workId;
    pRVar4->_flags = 0x1101;
    pRVar4->_allocableRegs = uVar17;
    pRVar4->_useRewriteMask = 0;
    pRVar4->_outRewriteMask = 0;
    (pRVar4->field_5).field_0._refCount = '\x01';
    (pRVar4->field_5).field_0._useId = bVar16;
    *(undefined2 *)((long)&pRVar4->field_5 + 2) = 0xff;
    workReg->_tiedReg = pRVar4;
    if (*(char *)((long)(this->_used)._masks + ((ulong)uVar22 - 8)) != -1) {
      (this->_count).field_0._packed =
           (this->_count).field_0._packed + (1 << ((byte)(uVar22 << 3) & 0x1f));
      return 0;
    }
  }
  addCallArg();
  if (extraout_EDX_00 == 0xff) {
    addCallRet();
LAB_00133488:
    addCallRet();
  }
  else {
    uVar22 = (workReg->_info)._signature >> 8 & 0xf;
    bVar16 = (byte)extraout_EDX_00;
    uVar17 = 1 << (bVar16 & 0x1f);
    this->_aggregatedFlags = this->_aggregatedFlags | 0x2202;
    if (3 < uVar22) goto LAB_00133488;
    puVar1 = (this->_used)._masks + uVar22;
    *puVar1 = *puVar1 | uVar17;
    (this->_stats)._packed = (this->_stats)._packed | 0x101 << (sbyte)uVar22;
    pRVar4 = workReg->_tiedReg;
    if (pRVar4 != (RATiedReg *)0x0) {
      if ((pRVar4->field_5).field_0._outId == 0xff) {
        (pRVar4->field_5).field_0._refCount = (pRVar4->field_5).field_0._refCount + '\x01';
        pRVar4->_flags = pRVar4->_flags | 0x2202;
        (pRVar4->field_5).field_0._outId = bVar16;
        return 0;
      }
      return 0x41;
    }
    pRVar4 = this->_cur;
    if (((int)((ulong)((long)pRVar4 + (-0x38 - (long)this)) >> 3) * -0x55555555 & 0xffffff80U) == 0)
    {
      this->_cur = pRVar4 + 1;
      pRVar4->_workId = workReg->_workId;
      pRVar4->_flags = 0x2202;
      pRVar4->_allocableRegs = uVar17;
      pRVar4->_useRewriteMask = 0;
      pRVar4->_outRewriteMask = 0;
      *(undefined2 *)&pRVar4->field_5 = 0xff01;
      (pRVar4->field_5).field_0._outId = bVar16;
      (pRVar4->field_5).field_0._rmSize = '\0';
      workReg->_tiedReg = pRVar4;
      if (*(char *)((long)(this->_used)._masks + ((ulong)uVar22 - 8)) != -1) {
        (this->_count).field_0._packed =
             (this->_count).field_0._packed + (1 << ((byte)(uVar22 << 3) & 0x1f));
        return 0;
      }
      goto LAB_00133492;
    }
  }
  addCallRet();
LAB_00133492:
  addCallRet();
  pRStack_68 = pRVar18;
  if (*(Logger **)(this->_tiedRegs + 1) != (Logger *)0x0) {
    Logger::logf(*(Logger **)(this->_tiedRegs + 1),__x);
  }
  EVar12 = RACFGBuilderT<asmjit::x86::RACFGBuilder>::prepare
                     ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this);
  if (EVar12 == 0) {
    lVar23._0_4_ = this->_tiedRegs[1]._workId;
    lVar23._4_4_ = this->_tiedRegs[1]._flags;
    if ((lVar23 != 0) &&
       (RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                  ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,
                   *(BaseNode **)(this->_clobbered)._masks,2,(char *)0x0),
       lVar5._0_4_ = this->_tiedRegs[1]._workId, lVar5._4_4_ = this->_tiedRegs[1]._flags, lVar5 != 0
       )) {
      RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,*(RABlock **)(this->_used)._masks,
                 2);
    }
    item = &this->_used;
    pBVar6 = *(BaseNode **)(this->_clobbered)._masks;
    invokeNode = (InvokeNode *)(pBVar6->field_0)._links[1];
    if (invokeNode != (InvokeNode *)0x0) {
      pRStack_ca8 = *(RABlock **)(this->_used)._masks;
      pRStack_ca8->_first = pBVar6;
      pRStack_ca8->_last = pBVar6;
      RStack_ca0._cur = RStack_ca0._tiedRegs;
      RStack_ca0._clobbered._masks[0] = 0;
      RStack_ca0._clobbered._masks[1] = 0;
      RStack_ca0._clobbered._masks[2] = 0;
      RStack_ca0._clobbered._masks[3] = 0;
      RStack_ca0._used._masks[0] = 0;
      RStack_ca0._used._masks[1] = 0;
      RStack_ca0._used._masks[2] = 0;
      RStack_ca0._used._masks[3] = 0;
      RStack_ca0._aggregatedFlags = 0;
      RStack_ca0._forbiddenFlags = 0;
      RStack_ca0._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
      RStack_ca0._stats._packed = 0;
      ZStack_cc0.super_ZoneVectorBase._data = (void *)0x0;
      ZStack_cc0.super_ZoneVectorBase._size = 0;
      ZStack_cc0.super_ZoneVectorBase._capacity = 0;
      pRStack_cd0 = item;
LAB_00133567:
      do {
        pRVar18 = RStack_ca0._tiedRegs;
        uVar3 = (invokeNode->super_InstNode).super_BaseNode._position;
        if (1 < uVar3 + 1) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O3/_deps/asmjit-src/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                     ,0x6f,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = (InvokeNode *)(invokeNode->super_InstNode).super_BaseNode.field_0._links[1];
        if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) == 0) {
          uVar11 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (uVar11 == '\x03') {
            pRVar13 = *(RABlock **)item->_masks;
            pRVar14 = (RABlock *)(invokeNode->super_InstNode).super_BaseNode._passData;
            if (pRVar13 == (RABlock *)0x0) {
              *(RABlock **)item->_masks = pRVar14;
              if (pRVar14 == (RABlock *)0x0) {
                pRVar14 = BaseRAPass::newBlock(*(BaseRAPass **)this,(BaseNode *)invokeNode);
                *(RABlock **)(this->_used)._masks = pRVar14;
                if (pRVar14 == (RABlock *)0x0) {
                  return 1;
                }
                (invokeNode->super_InstNode).super_BaseNode._passData = pRVar14;
                uVar22 = pRVar14->_flags;
              }
              else {
                uVar22 = pRVar14->_flags;
                if ((uVar22 & 1) != 0) goto LAB_00133c6f;
              }
              pRVar14->_flags = uVar22 | 4;
              *(undefined1 *)&this->_tiedRegs[0]._allocableRegs = 0;
              (this->_clobbered)._masks[2] = 0;
              EVar12 = BaseRAPass::addBlock(*(BaseRAPass **)this,pRVar14);
              if (EVar12 != 0) {
                return EVar12;
              }
              pRVar14 = *(RABlock **)pRStack_cd0->_masks;
            }
            else if (pRVar14 == (RABlock *)0x0) {
              if ((byte)(pRVar13 == pRStack_ca8 | (byte)this->_tiedRegs[0]._allocableRegs) == 1) {
                if ((InvokeNode *)pRVar13->_last == invokeNode) goto LAB_00133d03;
                pRVar13->_last = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar13->_flags = pRVar13->_flags | 0x201;
                (pRVar13->_regsStats)._packed =
                     (pRVar13->_regsStats)._packed | (this->_clobbered)._masks[2];
                pRVar13 = BaseRAPass::newBlock(*(BaseRAPass **)this,(BaseNode *)invokeNode);
                if (pRVar13 == (RABlock *)0x0) {
                  return 1;
                }
                *(byte *)&pRVar13->_flags = (byte)pRVar13->_flags | 4;
                EVar12 = RABlock::appendSuccessor(*(RABlock **)pRStack_cd0->_masks,pRVar13);
                if (EVar12 != 0) {
                  return EVar12;
                }
                EVar12 = BaseRAPass::addBlock(*(BaseRAPass **)this,pRVar13);
                if (EVar12 != 0) {
                  return EVar12;
                }
                *(RABlock **)(this->_used)._masks = pRVar13;
                *(undefined1 *)&this->_tiedRegs[0]._allocableRegs = 0;
                (this->_clobbered)._masks[2] = 0;
              }
              (invokeNode->super_InstNode).super_BaseNode._passData = pRVar13;
              pRVar14 = pRVar13;
            }
            else {
              *(byte *)&pRVar14->_flags = (byte)pRVar14->_flags | 4;
              if (pRVar13 == pRVar14) {
                pRVar14 = pRVar13;
                if ((char)this->_tiedRegs[0]._allocableRegs != '\0') break;
              }
              else {
                if ((InvokeNode *)pRVar13->_last == invokeNode) {
LAB_00133cfe:
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
LAB_00133d03:
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                  __clang_call_terminate(extraout_RAX);
                }
                pRVar13->_last = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar13->_flags = pRVar13->_flags | 0x201;
                (pRVar13->_regsStats)._packed =
                     (pRVar13->_regsStats)._packed | (this->_clobbered)._masks[2];
                EVar12 = RABlock::appendSuccessor(pRVar13,pRVar14);
                if (EVar12 != 0) {
                  return EVar12;
                }
                EVar12 = BaseRAPass::addBlock(*(BaseRAPass **)this,pRVar14);
                if (EVar12 != 0) {
                  return EVar12;
                }
                *(RABlock **)(this->_used)._masks = pRVar14;
                *(undefined1 *)&this->_tiedRegs[0]._allocableRegs = 0;
                (this->_clobbered)._masks[2] = 0;
              }
            }
            item = pRStack_cd0;
            lVar15._0_4_ = this->_tiedRegs[1]._workId;
            lVar15._4_4_ = this->_tiedRegs[1]._flags;
            if ((pRVar14 == (RABlock *)0x0) ||
               (pRVar14 == *(RABlock **)&this->_tiedRegs[0]._outRewriteMask)) {
LAB_00133b34:
              if (lVar15 != 0) {
                RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                          ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,(BaseNode *)invokeNode,2
                           ,(char *)0x0);
              }
            }
            else if (lVar15 != 0) {
              RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                        ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,pRVar14,2);
              lVar15._0_4_ = this->_tiedRegs[1]._workId;
              lVar15._4_4_ = this->_tiedRegs[1]._flags;
              goto LAB_00133b34;
            }
            if ((invokeNode->super_InstNode)._baseInst._id == (this->_clobbered)._masks[3]) {
              pRVar13 = *(RABlock **)(this->_used)._masks;
              pRVar13->_last = (BaseNode *)invokeNode;
              *(byte *)&pRVar13->_flags = (byte)pRVar13->_flags | 1;
              (pRVar13->_regsStats)._packed =
                   (pRVar13->_regsStats)._packed | (this->_clobbered)._masks[2];
              EVar12 = BaseRAPass::addExitBlock(*(BaseRAPass **)this,pRVar13);
LAB_0013390f:
              if (EVar12 != 0) {
                return EVar12;
              }
              goto LAB_00133b95;
            }
          }
          else {
            lVar7._0_4_ = this->_tiedRegs[1]._workId;
            lVar7._4_4_ = this->_tiedRegs[1]._flags;
            if (lVar7 != 0) {
              RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                        ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,(BaseNode *)invokeNode,4,
                         (char *)0x0);
              uVar11 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
            }
            if (uVar11 == '\n') {
              if (invokeNode == *(InvokeNode **)(*(long *)(this->_clobbered)._masks + 0x238)) {
                if (*(long *)item->_masks == 0) goto LAB_00133c6f;
                break;
              }
            }
            else if ((uVar11 == '\x10') && (invokeNode != *(InvokeNode **)(this->_clobbered)._masks)
                    ) break;
          }
        }
        else {
          if (*(long *)item->_masks == 0) {
            RACFGBuilderT<asmjit::x86::RACFGBuilder>::removeNode
                      ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,(BaseNode *)invokeNode);
            invokeNode = initialNode;
            goto LAB_00133567;
          }
          *(undefined1 *)&this->_tiedRegs[0]._allocableRegs = 1;
          uVar11 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if ((byte)(uVar11 - 0x11) < 2) {
            if (uVar3 == 0xffffffff) {
              (invokeNode->super_InstNode).super_BaseNode._position = 0;
            }
            else {
              pBVar6 = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
              if (uVar11 == '\x12') {
                EVar12 = x86::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,invokeNode);
              }
              else {
                EVar12 = x86::RACFGBuilder::onBeforeRet
                                   ((RACFGBuilder *)this,(FuncRetNode *)invokeNode);
              }
              if (EVar12 != 0) {
                return EVar12;
              }
              if (pBVar6 != (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev) {
                if (*(InvokeNode **)(*(long *)item->_masks + 0x10) == invokeNode) {
                  *(BaseNode **)(*(long *)item->_masks + 0x10) = (pBVar6->field_0).field_0._next;
                }
                (invokeNode->super_InstNode).super_BaseNode._position = 0xffffffff;
                invokeNode = (InvokeNode *)(pBVar6->field_0)._links[1];
                if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) ==
                    0) {
                  RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                  goto LAB_00133cfe;
                }
              }
              initialNode = (InvokeNode *)
                            (invokeNode->super_InstNode).super_BaseNode.field_0._links[1];
            }
          }
          lVar8._0_4_ = this->_tiedRegs[1]._workId;
          lVar8._4_4_ = this->_tiedRegs[1]._flags;
          if (lVar8 != 0) {
            RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logNode
                      ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,(BaseNode *)invokeNode,4,
                       (char *)0x0);
          }
          uStack_cd4 = 0;
          RStack_ca0._aggregatedFlags = 0;
          RStack_ca0._forbiddenFlags = 0;
          RStack_ca0._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          RStack_ca0._stats._packed = 0;
          RStack_ca0._used._masks[0] = 0;
          RStack_ca0._used._masks[1] = 0;
          RStack_ca0._used._masks[2] = 0;
          RStack_ca0._used._masks[3] = 0;
          RStack_ca0._clobbered._masks[0] = 0;
          RStack_ca0._clobbered._masks[1] = 0;
          RStack_ca0._clobbered._masks[2] = 0;
          RStack_ca0._clobbered._masks[3] = 0;
          RStack_ca0._cur = pRVar18;
          EVar12 = x86::RACFGBuilder::onInst
                             ((RACFGBuilder *)this,&invokeNode->super_InstNode,&uStack_cd4,
                              &RStack_ca0);
          if (EVar12 != 0) {
            return EVar12;
          }
          uVar11 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (uVar11 == '\x12') {
            EVar12 = x86::RACFGBuilder::onInvoke((RACFGBuilder *)this,invokeNode,&RStack_ca0);
            if (EVar12 != 0) {
              return EVar12;
            }
            uVar11 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          }
          if (uVar11 == '\x11') {
            EVar12 = x86::RACFGBuilder::onRet
                               ((RACFGBuilder *)this,(FuncRetNode *)invokeNode,&RStack_ca0);
            if (EVar12 != 0) {
              return EVar12;
            }
            uStack_cd4 = 4;
          }
          else if ((uStack_cd4 == 1) && (pRVar18 != RStack_ca0._cur)) {
            lVar23 = *(long *)this;
            uVar20 = 0;
            do {
              if (*(uint *)(lVar23 + 0x148) <= pRVar18->_workId) {
                RACFGBuilderT<asmjit::x86::RACFGBuilder>::run();
                goto LAB_00133ccd;
              }
              uVar21 = uVar20;
              if ((*(byte *)(*(long *)(*(long *)(lVar23 + 0x140) + (ulong)pRVar18->_workId * 8) +
                            0x21) & 0xf) == 0) {
                bVar16 = (pRVar18->field_5).field_0._useId;
                if (bVar16 == 0xff) {
                  uVar21 = (ulong)((int)uVar20 + 1);
                  bVar16 = *(byte *)(lVar23 + 0x114 + uVar20);
                  (pRVar18->field_5).field_0._useId = bVar16;
                }
                puVar2 = (uint *)(*(long *)item->_masks + 0xc0);
                *puVar2 = *puVar2 | 1 << (bVar16 & 0x1f);
              }
              pRVar18 = pRVar18 + 1;
              uVar20 = uVar21;
            } while (pRVar18 != RStack_ca0._cur);
          }
          EVar12 = BaseRAPass::assignRAInst
                             (*(BaseRAPass **)this,(BaseNode *)invokeNode,
                              *(RABlock **)(this->_used)._masks,&RStack_ca0);
          uVar3 = uStack_cd4;
          if (EVar12 != 0) {
            return EVar12;
          }
          uVar22 = (this->_clobbered)._masks[2] | RStack_ca0._stats._packed;
          (this->_clobbered)._masks[2] = uVar22;
          if (uStack_cd4 == 0) goto LAB_00133b9c;
          if (2 < uStack_cd4) {
            if (uStack_cd4 != 4) goto LAB_00133b9c;
            pRVar13 = *(RABlock **)(this->_used)._masks;
            pRVar13->_last = (BaseNode *)invokeNode;
            *(byte *)&pRVar13->_flags = (byte)pRVar13->_flags | 1;
            (pRVar13->_regsStats)._packed = (pRVar13->_regsStats)._packed | uVar22;
            EVar12 = RABlock::appendSuccessor(pRVar13,*(RABlock **)((this->_used)._masks + 2));
            goto LAB_0013390f;
          }
          pRVar13 = *(RABlock **)item->_masks;
          pRVar13->_last = (BaseNode *)invokeNode;
          uVar17 = pRVar13->_flags;
          pRVar13->_flags = uVar17 | 0x101;
          (pRVar13->_regsStats)._packed = (pRVar13->_regsStats)._packed | uVar22;
          if (((invokeNode->super_InstNode)._baseInst._options & 2) == 0) {
            bVar16 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._reserved0;
            if (bVar16 == 0) break;
            uVar22 = bVar16 - 1;
            if (((invokeNode->super_InstNode)._opArray[uVar22]._signature & 7) == 4) {
              EVar12 = BaseBuilder::labelNodeOf
                                 (*(BaseBuilder **)&this->_count,&pLStack_cc8,
                                  (invokeNode->super_InstNode)._opArray[uVar22]._baseId);
              if (EVar12 != 0) {
                return EVar12;
              }
              pRVar13 = BaseRAPass::newBlockOrExistingAt
                                  (*(BaseRAPass **)this,pLStack_cc8,(BaseNode **)0x0);
              if (pRVar13 == (RABlock *)0x0) {
                return 1;
              }
              *(byte *)&pRVar13->_flags = (byte)pRVar13->_flags | 4;
              EVar12 = RABlock::appendSuccessor(*(RABlock **)item->_masks,pRVar13);
            }
            else {
              pRVar13->_flags = uVar17 | 0x501;
              if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x0f') &&
                 (lVar23 = *(long *)&(invokeNode->_funcDetail)._callConv, lVar23 != 0)) {
                uVar24 = *(long *)(*(long *)this + 0xf8) + 1;
                *(uint64_t *)(*(long *)this + 0xf8) = uVar24;
                uVar22 = *(uint *)(lVar23 + 0x18);
                if ((ulong)uVar22 != 0) {
                  lStack_cb0 = *(long *)(lVar23 + 0x10);
                  lVar23 = 0;
                  do {
                    EVar12 = BaseBuilder::labelNodeOf
                                       (*(BaseBuilder **)&this->_count,&pLStack_cc8,
                                        *(uint32_t *)(lStack_cb0 + lVar23));
                    if (EVar12 != 0) {
                      return EVar12;
                    }
                    pRVar13 = BaseRAPass::newBlockOrExistingAt
                                        (*(BaseRAPass **)this,pLStack_cc8,(BaseNode **)0x0);
                    if (pRVar13 == (RABlock *)0x0) {
                      return 1;
                    }
                    if (pRVar13->_timestamp != uVar24) {
                      pRVar13->_timestamp = uVar24;
                      *(byte *)&pRVar13->_flags = (byte)pRVar13->_flags | 4;
                      EVar12 = RABlock::appendSuccessor(*(RABlock **)pRStack_cd0->_masks,pRVar13);
                      if (EVar12 != 0) {
                        return EVar12;
                      }
                    }
                    lVar23 = lVar23 + 4;
                  } while ((ulong)uVar22 << 2 != lVar23);
                  pRVar13 = *(RABlock **)pRStack_cd0->_masks;
                  item = pRStack_cd0;
                }
                EVar12 = RACFGBuilderT<asmjit::x86::RACFGBuilder>::shareAssignmentAcrossSuccessors
                                   ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,pRVar13);
              }
              else {
                EVar12 = ZoneVector<asmjit::RABlock_*>::append
                                   (&ZStack_cc0,(ZoneAllocator *)(*(long *)this + 0x18),
                                    (RABlock **)item);
              }
            }
            if (EVar12 != 0) {
              return EVar12;
            }
          }
          if (uVar3 != 1) {
            if (initialNode == (InvokeNode *)0x0) break;
            if ((((anon_union_4_4_9308554c_for_BaseNode_2 *)
                 ((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode + 1))->
                _any)._nodeType == '\x03') {
              pRVar13 = *(RABlock **)
                         &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)
                          [2].field_0;
              if (pRVar13 == (RABlock *)0x0) {
                pRVar13 = BaseRAPass::newBlock(*(BaseRAPass **)this,(BaseNode *)initialNode);
                if (pRVar13 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)
                 &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)[2].
                  field_0 = pRVar13;
              }
            }
            else {
              pRVar13 = BaseRAPass::newBlock(*(BaseRAPass **)this,(BaseNode *)initialNode);
              if (pRVar13 == (RABlock *)0x0) {
                return 1;
              }
            }
            pRVar14 = *(RABlock **)item->_masks;
            puVar1 = &pRVar14->_flags;
            *puVar1 = *puVar1 | 0x200;
            EVar12 = RABlock::prependSuccessor(pRVar14,pRVar13);
            if (EVar12 != 0) {
              return EVar12;
            }
            *(RABlock **)(this->_used)._masks = pRVar13;
            *(undefined1 *)&this->_tiedRegs[0]._allocableRegs = 0;
            (this->_clobbered)._masks[2] = 0;
            if ((pRVar13->_flags & 1) != 0) {
LAB_00133c6f:
              pvVar10 = ZStack_cc0.super_ZoneVectorBase._data;
              this_00 = *(BaseRAPass **)this;
              if (this_00->_createdBlockCount == (this_00->_blocks).super_ZoneVectorBase._size) {
                uVar20 = ZStack_cc0.super_ZoneVectorBase._8_8_ & 0xffffffff;
                if (uVar20 != 0) {
                  lVar23 = 0;
                  do {
                    RACFGBuilderT<asmjit::x86::RACFGBuilder>::handleBlockWithUnknownJump
                              ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,
                               *(RABlock **)((long)pvVar10 + lVar23));
                    lVar23 = lVar23 + 8;
                  } while (uVar20 << 3 != lVar23);
                  this_00 = *(BaseRAPass **)this;
                }
                EVar12 = BaseRAPass::initSharedAssignments
                                   (this_00,(ZoneVector<unsigned_int> *)&this->_cur);
                return EVar12;
              }
              return 3;
            }
            EVar12 = BaseRAPass::addBlock(*(BaseRAPass **)this,pRVar13);
            if (EVar12 != 0) {
              return EVar12;
            }
            lVar9._0_4_ = this->_tiedRegs[1]._workId;
            lVar9._4_4_ = this->_tiedRegs[1]._flags;
            invokeNode = initialNode;
            if (lVar9 != 0) {
              RACFGBuilderT<asmjit::x86::RACFGBuilder>::_logBlock
                        ((RACFGBuilderT<asmjit::x86::RACFGBuilder> *)this,
                         *(RABlock **)(this->_used)._masks,2);
            }
            goto LAB_00133567;
          }
LAB_00133b95:
          item->_masks[0] = 0;
          item->_masks[1] = 0;
        }
LAB_00133b9c:
        invokeNode = initialNode;
      } while (initialNode != (InvokeNode *)0x0);
    }
LAB_00133ccd:
    EVar12 = 3;
  }
  return EVar12;
}

Assistant:

Error add(RAWorkReg* workReg, uint32_t flags, uint32_t allocable, uint32_t useId, uint32_t useRewriteMask, uint32_t outId, uint32_t outRewriteMask, uint32_t rmSize = 0) noexcept {
    uint32_t group = workReg->group();
    RATiedReg* tiedReg = workReg->tiedReg();

    if (useId != BaseReg::kIdBad) {
      _stats.makeFixed(group);
      _used[group] |= Support::bitMask(useId);
      flags |= RATiedReg::kUseFixed;
    }

    if (outId != BaseReg::kIdBad) {
      _clobbered[group] |= Support::bitMask(outId);
      flags |= RATiedReg::kOutFixed;
    }

    _aggregatedFlags |= flags;
    _stats.makeUsed(group);

    if (!tiedReg) {
      // Could happen when the builder is not reset properly after each instruction.
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, allocable, useId, useRewriteMask, outId, outRewriteMask, rmSize);
      workReg->setTiedReg(tiedReg);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (useId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasUseId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setUseId(useId);
      }

      if (outId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasOutId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setOutId(outId);
      }

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->_allocableRegs &= allocable;
      tiedReg->_useRewriteMask |= useRewriteMask;
      tiedReg->_outRewriteMask |= outRewriteMask;
      tiedReg->_rmSize = uint8_t(Support::max<uint32_t>(tiedReg->rmSize(), rmSize));
      return kErrorOk;
    }
  }